

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O0

void __thiscall OPLmusicBlock::OffsetSamples(OPLmusicBlock *this,float *buff,int count)

{
  int b;
  int local_4c;
  int local_48;
  int largest_at;
  int ramp;
  int i;
  double step;
  double offset;
  double min;
  double max;
  int count_local;
  float *buff_local;
  OPLmusicBlock *this_local;
  
  min = -10000000000.0;
  offset = 10000000000.0;
  local_4c = 0;
  for (largest_at = 0; largest_at < count; largest_at = largest_at + 1) {
    if (min < (double)buff[largest_at]) {
      min = (double)buff[largest_at];
      local_4c = largest_at;
    }
    if ((double)buff[largest_at] < offset) {
      offset = (double)buff[largest_at];
      local_4c = largest_at;
    }
  }
  if ((((this->LastOffset != 0.0) || (NAN(this->LastOffset))) || (offset < -1.1)) || (1.1 < min)) {
    step = (min + offset) / 2.0;
    if (ABS(step) < 0.00390625) {
      step = 0.0;
    }
  }
  else {
    step = 0.0;
  }
  if (count < 0x200) {
    b = MAX<int>(0xc4,local_4c);
    local_48 = MIN<int>(count,b);
    _ramp = (step - this->LastOffset) / (double)local_48;
  }
  else {
    local_48 = 0x200;
    _ramp = (step - this->LastOffset) / 512.0;
  }
  step = this->LastOffset;
  largest_at = 0;
  if ((_ramp != 0.0) || (NAN(_ramp))) {
    for (; largest_at < local_48; largest_at = largest_at + 1) {
      buff[largest_at] = (float)((double)buff[largest_at] - step);
      step = _ramp + step;
    }
  }
  if ((step != 0.0) || (NAN(step))) {
    for (; largest_at < count; largest_at = largest_at + 1) {
      buff[largest_at] = (float)((double)buff[largest_at] - step);
    }
  }
  this->LastOffset = (double)(float)step;
  return;
}

Assistant:

void OPLmusicBlock::OffsetSamples(float *buff, int count)
{
	// Three out of four of the OPL waveforms are non-negative. Depending on
	// timbre selection, this can cause the output waveform to tend toward
	// very large positive values. Heretic's music is particularly bad for
	// this. This function attempts to compensate by offseting the sample
	// data back to around the [-1.0, 1.0] range.

	double max = -1e10, min = 1e10, offset, step;
	int i, ramp, largest_at = 0;

	// Find max and min values for this segment of the waveform.
	for (i = 0; i < count; ++i)
	{
		if (buff[i] > max)
		{
			max = buff[i];
			largest_at = i;
		}
		if (buff[i] < min)
		{
			min = buff[i];
			largest_at = i;
		}
	}
	// Prefer to keep the offset at 0, even if it means a little clipping.
	if (LastOffset == 0 && min >= -1.1 && max <= 1.1)
	{
		offset = 0;
	}
	else
	{
		offset = (max + min) / 2;
		// If the new offset is close to 0, make it 0 to avoid making another
		// full loop through the sample data.
		if (fabs(offset) < 1/256.0)
		{
			offset = 0;
		}
	}
	// Ramp the offset change so there aren't any abrupt clicks in the output.
	// If the ramp is too short, it can sound scratchy. cblood2.mid is
	// particularly unforgiving of short ramps.
	if (count >= 512)
	{
		ramp = 512;
		step = (offset - LastOffset) / 512;
	}
	else
	{
		ramp = MIN(count, MAX(196, largest_at));
		step = (offset - LastOffset) / ramp;
	}
	offset = LastOffset;
	i = 0;
	if (step != 0)
	{
		for (; i < ramp; ++i)
		{
			buff[i] = float(buff[i] - offset);
			offset += step;
		}
	}
	if (offset != 0)
	{
		for (; i < count; ++i)
		{
			buff[i] = float(buff[i] - offset);
		}
	}
	LastOffset = float(offset);
}